

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadialGradientShadingPatternWritingTask.cpp
# Opt level: O2

void __thiscall
RadialGradientShadingPatternWritingTask::RadialGradientShadingPatternWritingTask
          (RadialGradientShadingPatternWritingTask *this,double inX0,double inY0,double inR0,
          double inX1,double inY1,double inR1,InterpretedGradientStopList *inColorLine,
          FT_PaintExtend inGradientExtend,PDFRectangle *inBounds,PDFMatrix *inMatrix,
          ObjectIDType inPatternObjectId)

{
  InterpretedGradientStopList *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  (this->super_IObjectEndWritingTask)._vptr_IObjectEndWritingTask =
       (_func_int **)&PTR__RadialGradientShadingPatternWritingTask_00370868;
  this_00 = &this->mColorLine;
  (this->mColorLine).
  super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->mColorLine).
  super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->mColorLine).
  super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl.
  _M_node._M_size = 0;
  PDFRectangle::PDFRectangle(&this->mBounds);
  PDFMatrix::PDFMatrix(&this->mMatrix);
  this->x0 = inX0;
  this->y0 = inY0;
  this->r0 = inR0;
  this->x1 = inX1;
  this->y1 = inY1;
  this->r1 = inR1;
  std::__cxx11::list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::operator=
            (this_00,inColorLine);
  this->mGradientExtend = inGradientExtend;
  dVar1 = inBounds->LowerLeftX;
  dVar2 = inBounds->LowerLeftY;
  dVar3 = inBounds->UpperRightY;
  (this->mBounds).UpperRightX = inBounds->UpperRightX;
  (this->mBounds).UpperRightY = dVar3;
  (this->mBounds).LowerLeftX = dVar1;
  (this->mBounds).LowerLeftY = dVar2;
  dVar1 = inMatrix->a;
  dVar2 = inMatrix->b;
  dVar3 = inMatrix->c;
  dVar4 = inMatrix->d;
  dVar5 = inMatrix->f;
  (this->mMatrix).e = inMatrix->e;
  (this->mMatrix).f = dVar5;
  (this->mMatrix).c = dVar3;
  (this->mMatrix).d = dVar4;
  (this->mMatrix).a = dVar1;
  (this->mMatrix).b = dVar2;
  this->mPatternObjectId = inPatternObjectId;
  return;
}

Assistant:

RadialGradientShadingPatternWritingTask::RadialGradientShadingPatternWritingTask(
    double inX0,
    double inY0,
    double inR0,
    double inX1,
    double inY1,
    double inR1,
    InterpretedGradientStopList inColorLine,
    FT_PaintExtend inGradientExtend,
    PDFRectangle inBounds,
    PDFMatrix inMatrix,
    ObjectIDType inPatternObjectId
) {
   x0 = inX0;
   y0 = inY0;
   r0 = inR0;
   x1 = inX1;
   y1 = inY1;
   r1 = inR1;
   mColorLine = inColorLine;
   mGradientExtend = inGradientExtend;
   mBounds = inBounds;
   mMatrix = inMatrix;
   mPatternObjectId = inPatternObjectId;
}